

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O2

DdNode * Extra_bddComputeSum(DdManager *dd,DdNode **pbCubes,int nCubes)

{
  DdNode *n;
  ulong uVar1;
  ulong uVar2;
  DdNode *n_00;
  
  n_00 = (DdNode *)((ulong)dd->one ^ 1);
  Cudd_Ref(n_00);
  uVar2 = 0;
  uVar1 = (ulong)(uint)nCubes;
  if (nCubes < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    n = Cudd_bddOr(dd,n_00,pbCubes[uVar2]);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,n_00);
    n_00 = n;
  }
  Cudd_Deref(n_00);
  return n_00;
}

Assistant:

DdNode * Extra_bddComputeSum( DdManager * dd, DdNode ** pbCubes, int nCubes )
{
    DdNode * bRes, * bTemp;
    int i;
    bRes = b0; Cudd_Ref( bRes );
    for ( i = 0; i < nCubes; i++ )
    {
        bRes = Cudd_bddOr( dd, bTemp = bRes, pbCubes[i] );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    return bRes;
}